

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimeCoordinator.cpp
# Opt level: O2

void __thiscall helics::TimeCoordinator::updateTimeGrant(TimeCoordinator *this)

{
  int32_t *piVar1;
  uint uVar2;
  baseType bVar3;
  ActionMessage treq;
  
  if (this->iterating != FORCE_ITERATION) {
    bVar3 = (this->time_exec).internalTimeCode;
    (this->time_granted).internalTimeCode = bVar3;
    (this->time_grantBase).internalTimeCode = bVar3;
  }
  piVar1 = &(this->super_BaseTimeCoordinator).sequenceCounter;
  *piVar1 = *piVar1 + 1;
  ActionMessage::ActionMessage(&treq,cmd_time_grant);
  treq.source_id.gid = (this->super_BaseTimeCoordinator).mSourceId.gid;
  treq.actionTime.internalTimeCode = (this->time_granted).internalTimeCode;
  uVar2 = (this->super_BaseTimeCoordinator).sequenceCounter;
  treq.counter = (uint16_t)uVar2;
  if (0xffff < uVar2) {
    (this->super_BaseTimeCoordinator).sequenceCounter = 0;
  }
  if (this->iterating != NO_ITERATIONS) {
    TimeDependencies::resetIteratingTimeRequests
              (&(this->super_BaseTimeCoordinator).dependencies,
               (Time)(this->time_exec).internalTimeCode);
  }
  (this->lastSend).next.internalTimeCode = treq.actionTime.internalTimeCode;
  (this->lastSend).Te.internalTimeCode = treq.actionTime.internalTimeCode;
  (this->lastSend).minDe.internalTimeCode = treq.actionTime.internalTimeCode;
  (this->lastSend).mTimeState = time_granted;
  transmitTimingMessages(this,&treq,(GlobalFederateId)0x8831d580);
  ActionMessage::~ActionMessage(&treq);
  return;
}

Assistant:

void TimeCoordinator::updateTimeGrant()
{
    if (iterating != IterationRequest::FORCE_ITERATION) {
        time_granted = time_exec;
        time_grantBase = time_granted;
    }
    ++sequenceCounter;
    ActionMessage treq(CMD_TIME_GRANT);
    treq.source_id = mSourceId;
    treq.actionTime = time_granted;
    treq.counter = sequenceCounter;
    if (static_cast<std::int32_t>(treq.counter) != sequenceCounter) {
        sequenceCounter = 0;
    }
    if (iterating != IterationRequest::NO_ITERATIONS) {
        dependencies.resetIteratingTimeRequests(time_exec);
    }
    lastSend.next = treq.actionTime;
    lastSend.Te = treq.actionTime;
    lastSend.minDe = treq.actionTime;
    lastSend.mTimeState = TimeState::time_granted;
    transmitTimingMessages(treq);
    // printf("%d GRANT allow=%f next=%f, exec=%f, Tdemin=%f\n", source_id,
    // static_cast<double>(time_allow), static_cast<double>(time_next),
    // static_cast<double>(time_exec), static_cast<double>(time_minDe));
}